

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

void __thiscall PrintMenu::act(PrintMenu *this,Restaurant *restaurant)

{
  pointer pDVar1;
  DishType type;
  int iVar2;
  vector<Dish,_std::allocator<Dish>_> *pvVar3;
  ostream *poVar4;
  PrintMenu *this_00;
  pointer this_01;
  string local_70;
  string local_50;
  
  pvVar3 = Restaurant::getMenu(restaurant);
  pDVar1 = (pvVar3->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  for (this_01 = (pvVar3->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pDVar1; this_01 = this_01 + 1) {
    Dish::getName_abi_cxx11_(&local_50,this_01);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    this_00 = (PrintMenu *)0x10a232;
    poVar4 = std::operator<<(poVar4," ");
    type = Dish::getType(this_01);
    findMyType_abi_cxx11_(&local_70,this_00,type);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4," ");
    iVar2 = Dish::getPrice(this_01);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::operator<<(poVar4,"NIS \n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  (this->super_BaseAction).status = COMPLETED;
  return;
}

Assistant:

void PrintMenu::act(Restaurant &restaurant)
{
    for (auto &i : restaurant.getMenu()) {
        std::cout << i.getName() << " " << findMyType(i.getType()) << " " << i.getPrice() << "NIS \n";
    }
    complete();
}